

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<char,_long_long,_18>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *lhs,longlong *rhs,longlong *result)

{
  code *pcVar1;
  long lVar2;
  long *in_RDX;
  long *in_RSI;
  char *in_RDI;
  int64_t tmp;
  
  lVar2 = (long)*in_RDI - *in_RSI;
  if (SBORROW8((long)*in_RDI,*in_RSI)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if ((((*in_RDI < '\0') || (-1 < *in_RSI)) || (*in_RDI <= lVar2)) &&
     ((*in_RSI < 1 || (lVar2 <= *in_RDI)))) {
    *in_RDX = lVar2;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is any signed int32 or smaller, rhs is int64
        std::int64_t tmp = (std::int64_t)lhs - rhs;

        if( ( lhs >= 0 && rhs < 0 && tmp < lhs ) ||
            ( rhs > 0 && tmp > lhs ) )
        {
            E::SafeIntOnOverflow();
            //else OK
        }

        result = (T)tmp;
    }